

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps_test.cc
# Opt level: O3

Test * MissingDependencyScannerTestMissingDepFixedDirect::Create(void)

{
  MissingDependencyScannerTest *this;
  
  this = (MissingDependencyScannerTest *)operator_new(0x410);
  MissingDependencyScannerTest::MissingDependencyScannerTest(this);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__MissingDependencyScannerTest_001fc968;
  g_current_test = (Test *)this;
  return &this->super_Test;
}

Assistant:

TEST_F(MissingDependencyScannerTest, MissingDepFixedDirect) {
  CreateInitialState();
  // Adding the direct dependency fixes the missing dep
  CreateGraphDependencyBetween("compiled_object", "generated_header");
  RecordDepsLogDep("compiled_object", "generated_header");
  ProcessAllNodes();
  ASSERT_FALSE(scanner().HadMissingDeps());
}